

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Function.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,FunctionType *funcTy)

{
  ostream *poVar1;
  Type **paramTy;
  pointer ppTVar2;
  _Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_38;
  
  if (funcTy != (FunctionType *)0x0) {
    std::operator<<(os,"<FunctionType | ");
    poVar1 = std::operator<<(os," return-type:");
    operator<<(poVar1,*(Type **)((funcTy->super_Type).impl_._M_t.
                                 super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                                 .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>.
                                 _M_head_impl + 2));
    FunctionType::parameterTypes
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&local_38,
               funcTy);
    for (ppTVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
        ppTVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
      std::operator<<(os," parameter-type:");
      operator<<(os,*ppTVar2);
    }
    std::_Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~_Vector_base
              (&local_38);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<FunctionType is null>");
  return poVar1;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const FunctionType* funcTy)
{
    if (!funcTy)
        return os << "<FunctionType is null>";
    os << "<FunctionType | ";
    os << " return-type:" << funcTy->returnType();
    for (const auto& paramTy : funcTy->parameterTypes()) {
        os << " parameter-type:";
        os << paramTy;
    }
    os << ">";
    return os;
}